

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O2

void __thiscall mocker::CodegenPreparation::naiveStrengthReduction(CodegenPreparation *this)

{
  _List_node_base *this_00;
  int iVar1;
  _func_int **pp_Var2;
  long lVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int i;
  int iVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  shared_ptr<mocker::ir::IntLiteral> lit;
  int pos;
  shared_ptr<mocker::ir::ArithBinaryInst> binary;
  shared_ptr<mocker::ir::Addr> local_b0;
  undefined1 local_a0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  long local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> local_78;
  _List_node_base *local_68;
  _List_node_base *local_60;
  _List_node_base *local_58;
  __shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2> local_50;
  int local_40 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_60 = (_List_node_base *)&((this->super_FuncPass).func)->bbs;
  local_68 = local_60;
  do {
    local_60 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                &local_60->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (local_60 == local_68) {
      return;
    }
    p_Var8 = (_List_node_base *)&local_60[1]._M_prev;
    p_Var9 = p_Var8;
    local_58 = p_Var8;
    while( true ) {
      p_Var8 = p_Var8->_M_next;
      if (p_Var8 == p_Var9) break;
      this_00 = p_Var8 + 1;
      ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)&local_88,(shared_ptr<mocker::ir::IRInst> *)this_00);
      if (local_88 != 0) {
        std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                   (__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x30));
        std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,
                   (__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x40));
        std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(&local_b0);
        if (local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          iVar1 = *(int *)(local_88 + 0x28);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          _Var5._M_pi = local_78._M_refcount._M_pi;
          peVar4 = local_78._M_ptr;
          if (iVar1 != 8) {
            local_78._M_ptr = (element_type *)local_a0._8_8_;
            local_78._M_refcount._M_pi = _Stack_90._M_pi;
            local_a0._8_8_ = peVar4;
            _Stack_90._M_pi = _Var5._M_pi;
          }
        }
        std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>(&local_b0);
        lVar3 = local_88;
        iVar1 = *(int *)(local_88 + 0x28);
        if (iVar1 - 7U < 2) {
          if (((local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) &&
              (pp_Var2 = local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr[1]._vptr_Addr, 0 < (long)pp_Var2)) &&
             (((ulong)pp_Var2 & (long)pp_Var2 - 1U) == 0)) {
            uVar7 = 0;
            while( true ) {
              iVar6 = (int)uVar7;
              if (iVar6 == 8) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp"
                              ,0x9c,
                              "int mocker::(anonymous namespace)::getNonzeroPos(std::uint64_t)");
              }
              if (((ulong)pp_Var2 >> (uVar7 & 0x3f) & 1) != 0) break;
              uVar7 = (ulong)(iVar6 + 1);
            }
            local_a0._0_4_ = (iVar1 != 7) + 3;
            local_a0._4_4_ = iVar6;
            std::make_shared<mocker::ir::IntLiteral,int&>(local_40);
            std::
            make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::IntLiteral>>
                      ((shared_ptr<mocker::ir::Reg> *)&local_50,(OpType *)(lVar3 + 0x18),
                       (shared_ptr<mocker::ir::Addr> *)local_a0,
                       (shared_ptr<mocker::ir::IntLiteral> *)(local_a0 + 8));
            std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)this_00,
                       &local_50);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
          }
        }
        else if (((iVar1 == 5) &&
                 (local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0)) &&
                (local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                 ._vptr_Addr == (_func_int **)0x0)) {
          std::
          make_shared<mocker::ir::Assign,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>&>
                    ((shared_ptr<mocker::ir::Reg> *)&local_50,
                     (shared_ptr<mocker::ir::Addr> *)(local_88 + 0x18));
          std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)this_00,
                     (__shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
          p_Var9 = local_58;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    }
  } while( true );
}

Assistant:

void CodegenPreparation::naiveStrengthReduction() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto binary = ir::dyc<ir::ArithBinaryInst>(inst);
      if (!binary)
        continue;
      auto lhs = binary->getLhs(), rhs = binary->getRhs();
      // Associativity is required here
      if (ir::dyc<ir::IntLiteral>(lhs) &&
          binary->getOp() != ir::ArithBinaryInst::Div)
        std::swap(lhs, rhs);
      auto lit = ir::dyc<ir::IntLiteral>(rhs);

      if (binary->getOp() == ir::ArithBinaryInst::Mul ||
          binary->getOp() == ir::ArithBinaryInst::Div) {
        if (!lit || lit->getVal() <= 0)
          continue;
        auto pos = getNonzeroPos(lit->getVal());
        if (pos == -1)
          continue;
        inst = std::make_shared<ir::ArithBinaryInst>(
            binary->getDest(),
            binary->getOp() == ir::ArithBinaryInst::Mul
                ? ir::ArithBinaryInst::Shl
                : ir::ArithBinaryInst::Shr,
            lhs, std::make_shared<ir::IntLiteral>(pos));
        continue;
      }

      if (binary->getOp() == ir::ArithBinaryInst::Add && lit &&
          lit->getVal() == 0) {
        inst = std::make_shared<ir::Assign>(binary->getDest(), lhs);
        continue;
      }
    }
  }
}